

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_Swap_Test<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Swap_Test<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  key_type kVar2;
  hasher *hf;
  key_type alloc;
  Hasher HVar3;
  int i_2;
  TypeParam empty_ht;
  int i_1;
  TypeParam swap_to_clear_ht;
  AssertionResult gtest_ar_23;
  AssertionResult gtest_ar_22;
  AssertionResult gtest_ar_21;
  AssertionResult gtest_ar_20;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  size_type expected_buckets;
  int i;
  TypeParam other_ht;
  hasher hasher;
  value_type in_stack_fffffffffffff4e8;
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff4f0;
  value_type in_stack_fffffffffffff4f8;
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff500;
  key_equal *in_stack_fffffffffffff508;
  hasher *in_stack_fffffffffffff510;
  size_type in_stack_fffffffffffff518;
  Type type;
  HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffff520;
  undefined4 in_stack_fffffffffffff568;
  undefined4 in_stack_fffffffffffff56c;
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff570;
  int local_834;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_828 [13];
  value_type local_74c;
  int local_744;
  key_type local_740;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_738 [12];
  key_type local_678;
  hasher *local_670;
  undefined4 local_664;
  AssertionResult local_660 [2];
  key_type local_640;
  size_type local_638;
  undefined4 local_62c;
  AssertionResult local_628 [2];
  size_type local_608;
  undefined4 local_5fc;
  AssertionResult local_5f8 [2];
  size_type local_5d8;
  undefined4 local_5cc;
  AssertionResult local_5c8 [2];
  Hasher local_5a8;
  Hasher local_598;
  int local_588;
  undefined4 local_584;
  AssertionResult local_580 [2];
  Hasher local_560;
  Hasher local_550;
  int local_540;
  undefined4 local_53c;
  AssertionResult local_538 [2];
  key_type local_518;
  key_type local_510;
  AssertionResult local_508 [2];
  key_type local_4e8;
  key_type local_4e0;
  AssertionResult local_4d8 [2];
  key_type local_4b8;
  size_type local_4b0;
  undefined4 local_4a4;
  AssertionResult local_4a0 [2];
  key_type local_480;
  size_type local_478;
  undefined4 local_46c;
  AssertionResult local_468 [2];
  key_type local_448;
  size_type local_440;
  undefined4 local_434;
  AssertionResult local_430 [2];
  key_type local_410;
  size_type local_408;
  undefined4 local_3fc;
  AssertionResult local_3f8 [2];
  key_type local_3d8;
  size_type local_3d0;
  undefined4 local_3c4;
  AssertionResult local_3c0 [2];
  key_type local_3a0;
  size_type local_398;
  undefined4 local_38c;
  AssertionResult local_388 [2];
  size_type local_368;
  undefined4 local_35c;
  AssertionResult local_358 [2];
  size_type local_338;
  undefined4 local_32c;
  AssertionResult local_328 [2];
  undefined4 local_304;
  size_type local_300;
  AssertionResult local_2f8 [2];
  size_type local_2d8;
  AssertionResult local_2d0 [2];
  Hasher local_2b0;
  Hasher local_2a0;
  int local_290;
  undefined4 local_28c;
  AssertionResult local_288 [2];
  Hasher local_268;
  Hasher local_258;
  int local_248;
  undefined4 local_244;
  AssertionResult local_240 [2];
  Hasher local_220;
  Hasher local_210;
  int local_200;
  undefined4 local_1fc;
  AssertionResult local_1f8 [2];
  Hasher local_1d8;
  Hasher local_1c8;
  int local_1b8;
  undefined4 local_1b4;
  AssertionResult local_1b0 [2];
  key_type local_190;
  key_type local_188;
  AssertionResult local_180 [2];
  key_type local_160;
  key_type local_158;
  AssertionResult local_150;
  size_type local_140;
  value_type local_110;
  key_type local_108;
  value_type local_d8;
  int local_d0;
  key_type local_cc;
  key_type local_c4;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_b0 [11];
  
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8.second);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_b0,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            (in_stack_fffffffffffff520,in_stack_fffffffffffff518,in_stack_fffffffffffff510,
             in_stack_fffffffffffff508,(allocator_type *)in_stack_fffffffffffff500);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_b0);
  local_c4 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                          *)in_stack_fffffffffffff4f8,
                         (int)((ulong)in_stack_fffffffffffff4f0 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key(in_stack_fffffffffffff4f0,(key_type *)in_stack_fffffffffffff4e8);
  local_cc = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                          *)in_stack_fffffffffffff4f8,
                         (int)((ulong)in_stack_fffffffffffff4f0 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key(in_stack_fffffffffffff4f0,(key_type *)in_stack_fffffffffffff4e8);
  for (local_d0 = 3; type = (Type)(in_stack_fffffffffffff518 >> 0x20), local_d0 < 2000;
      local_d0 = local_d0 + 1) {
    local_d8 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                               *)in_stack_fffffffffffff4e8,0);
    google::
    BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffff570,
             (value_type *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
  }
  local_108 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)in_stack_fffffffffffff4f8,
                          (int)((ulong)in_stack_fffffffffffff4f0 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::erase(in_stack_fffffffffffff4f0,(key_type *)in_stack_fffffffffffff4e8);
  local_110 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)in_stack_fffffffffffff4e8,0);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff570,
           (value_type *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
  local_140 = google::
              BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xc1e9b4);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::swap(in_stack_fffffffffffff4f0,
         (BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)in_stack_fffffffffffff4e8);
  local_158 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)in_stack_fffffffffffff4f8,
                          (int)((ulong)in_stack_fffffffffffff4f0 >> 0x20));
  local_160 = google::
              BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::deleted_key((BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)in_stack_fffffffffffff4e8);
  testing::internal::EqHelper::Compare<std::pair<int,_int>,_std::pair<int,_int>,_nullptr>
            ((char *)in_stack_fffffffffffff508,(char *)in_stack_fffffffffffff500,
             (pair<int,_int> *)in_stack_fffffffffffff4f8,(pair<int,_int> *)in_stack_fffffffffffff4f0
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_150);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff520);
    testing::AssertionResult::failure_message((AssertionResult *)0xc1eaa1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff520,type,(char *)in_stack_fffffffffffff510,
               (int)((ulong)in_stack_fffffffffffff508 >> 0x20),(char *)in_stack_fffffffffffff500);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff570,
               (Message *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4f0);
    testing::Message::~Message((Message *)0xc1eb04);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc1eb75);
  local_188 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)in_stack_fffffffffffff4f8,
                          (int)((ulong)in_stack_fffffffffffff4f0 >> 0x20));
  local_190 = google::
              BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::deleted_key((BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)in_stack_fffffffffffff4e8);
  testing::internal::EqHelper::Compare<std::pair<int,_int>,_std::pair<int,_int>,_nullptr>
            ((char *)in_stack_fffffffffffff508,(char *)in_stack_fffffffffffff500,
             (pair<int,_int> *)in_stack_fffffffffffff4f8,(pair<int,_int> *)in_stack_fffffffffffff4f0
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_180);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff520);
    testing::AssertionResult::failure_message((AssertionResult *)0xc1ec3b);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff520,type,(char *)in_stack_fffffffffffff510,
               (int)((ulong)in_stack_fffffffffffff508 >> 0x20),(char *)in_stack_fffffffffffff500);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff570,
               (Message *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4f0);
    testing::Message::~Message((Message *)0xc1ec9e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc1ed0f);
  local_1b4 = 1;
  local_1d8 = (Hasher)google::
                      BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      ::hash_funct(in_stack_fffffffffffff500);
  local_1c8 = local_1d8;
  local_1b8 = Hasher::id(&local_1c8);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffff508,(char *)in_stack_fffffffffffff500,
             (int *)in_stack_fffffffffffff4f8,(int *)in_stack_fffffffffffff4f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1b0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff520);
    testing::AssertionResult::failure_message((AssertionResult *)0xc1edff);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff520,type,(char *)in_stack_fffffffffffff510,
               (int)((ulong)in_stack_fffffffffffff508 >> 0x20),(char *)in_stack_fffffffffffff500);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff570,
               (Message *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4f0);
    testing::Message::~Message((Message *)0xc1ee62);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc1eed3);
  local_1fc = 0;
  local_220 = (Hasher)google::
                      BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      ::hash_funct(in_stack_fffffffffffff500);
  local_210 = local_220;
  local_200 = Hasher::id(&local_210);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffff508,(char *)in_stack_fffffffffffff500,
             (int *)in_stack_fffffffffffff4f8,(int *)in_stack_fffffffffffff4f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1f8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff520);
    testing::AssertionResult::failure_message((AssertionResult *)0xc1efbf);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff520,type,(char *)in_stack_fffffffffffff510,
               (int)((ulong)in_stack_fffffffffffff508 >> 0x20),(char *)in_stack_fffffffffffff500);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff570,
               (Message *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4f0);
    testing::Message::~Message((Message *)0xc1f022);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc1f093);
  local_244 = 1;
  local_268 = (Hasher)google::
                      BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      ::key_eq(in_stack_fffffffffffff500);
  local_258 = local_268;
  local_248 = Hasher::id(&local_258);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffff508,(char *)in_stack_fffffffffffff500,
             (int *)in_stack_fffffffffffff4f8,(int *)in_stack_fffffffffffff4f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_240);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff520);
    testing::AssertionResult::failure_message((AssertionResult *)0xc1f183);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff520,type,(char *)in_stack_fffffffffffff510,
               (int)((ulong)in_stack_fffffffffffff508 >> 0x20),(char *)in_stack_fffffffffffff500);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff570,
               (Message *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4f0);
    testing::Message::~Message((Message *)0xc1f1e6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc1f257);
  local_28c = 0;
  local_2b0 = (Hasher)google::
                      BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      ::key_eq(in_stack_fffffffffffff500);
  local_2a0 = local_2b0;
  local_290 = Hasher::id(&local_2a0);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffff508,(char *)in_stack_fffffffffffff500,
             (int *)in_stack_fffffffffffff4f8,(int *)in_stack_fffffffffffff4f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_288);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff520);
    testing::AssertionResult::failure_message((AssertionResult *)0xc1f343);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff520,type,(char *)in_stack_fffffffffffff510,
               (int)((ulong)in_stack_fffffffffffff508 >> 0x20),(char *)in_stack_fffffffffffff500);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff570,
               (Message *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4f0);
    testing::Message::~Message((Message *)0xc1f3a6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc1f414);
  local_2d8 = google::
              BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xc1f425);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff508,(char *)in_stack_fffffffffffff500,
             (unsigned_long *)in_stack_fffffffffffff4f8,(unsigned_long *)in_stack_fffffffffffff4f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2d0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff520);
    testing::AssertionResult::failure_message((AssertionResult *)0xc1f4b2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff520,type,(char *)in_stack_fffffffffffff510,
               (int)((ulong)in_stack_fffffffffffff508 >> 0x20),(char *)in_stack_fffffffffffff500);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff570,
               (Message *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4f0);
    testing::Message::~Message((Message *)0xc1f515);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc1f586);
  local_300 = google::
              BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xc1f593);
  local_304 = 200;
  testing::internal::CmpHelperGT<unsigned_long,unsigned_int>
            ((char *)in_stack_fffffffffffff508,(char *)in_stack_fffffffffffff500,
             (unsigned_long *)in_stack_fffffffffffff4f8,(uint *)in_stack_fffffffffffff4f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2f8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff520);
    testing::AssertionResult::failure_message((AssertionResult *)0xc1f62b);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff520,type,(char *)in_stack_fffffffffffff510,
               (int)((ulong)in_stack_fffffffffffff508 >> 0x20),(char *)in_stack_fffffffffffff500);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff570,
               (Message *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4f0);
    testing::Message::~Message((Message *)0xc1f68e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc1f6ff);
  local_32c = 1;
  local_338 = google::
              BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xc1f71b);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff508,(char *)in_stack_fffffffffffff500,
             (uint *)in_stack_fffffffffffff4f8,(unsigned_long *)in_stack_fffffffffffff4f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_328);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff520);
    testing::AssertionResult::failure_message((AssertionResult *)0xc1f7a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff520,type,(char *)in_stack_fffffffffffff510,
               (int)((ulong)in_stack_fffffffffffff508 >> 0x20),(char *)in_stack_fffffffffffff500);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff570,
               (Message *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4f0);
    testing::Message::~Message((Message *)0xc1f80b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc1f87c);
  local_35c = 0x7cc;
  local_368 = google::
              BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xc1f894);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff508,(char *)in_stack_fffffffffffff500,
             (uint *)in_stack_fffffffffffff4f8,(unsigned_long *)in_stack_fffffffffffff4f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_358);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff520);
    testing::AssertionResult::failure_message((AssertionResult *)0xc1f921);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff520,type,(char *)in_stack_fffffffffffff510,
               (int)((ulong)in_stack_fffffffffffff508 >> 0x20),(char *)in_stack_fffffffffffff500);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff570,
               (Message *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4f0);
    testing::Message::~Message((Message *)0xc1f984);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc1f9f5);
  local_38c = 0;
  local_3a0 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)in_stack_fffffffffffff4f8,
                          (int)((ulong)in_stack_fffffffffffff4f0 >> 0x20));
  local_398 = google::
              BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(in_stack_fffffffffffff4f0,(key_type *)in_stack_fffffffffffff4e8);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff508,(char *)in_stack_fffffffffffff500,
             (uint *)in_stack_fffffffffffff4f8,(unsigned_long *)in_stack_fffffffffffff4f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_388);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff520);
    testing::AssertionResult::failure_message((AssertionResult *)0xc1fadd);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff520,type,(char *)in_stack_fffffffffffff510,
               (int)((ulong)in_stack_fffffffffffff508 >> 0x20),(char *)in_stack_fffffffffffff500);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff570,
               (Message *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4f0);
    testing::Message::~Message((Message *)0xc1fb40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc1fbb1);
  local_3c4 = 1;
  local_3d8 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)in_stack_fffffffffffff4f8,
                          (int)((ulong)in_stack_fffffffffffff4f0 >> 0x20));
  local_3d0 = google::
              BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(in_stack_fffffffffffff4f0,(key_type *)in_stack_fffffffffffff4e8);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff508,(char *)in_stack_fffffffffffff500,
             (uint *)in_stack_fffffffffffff4f8,(unsigned_long *)in_stack_fffffffffffff4f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3c0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff520);
    testing::AssertionResult::failure_message((AssertionResult *)0xc1fc8a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff520,type,(char *)in_stack_fffffffffffff510,
               (int)((ulong)in_stack_fffffffffffff508 >> 0x20),(char *)in_stack_fffffffffffff500);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff570,
               (Message *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4f0);
    testing::Message::~Message((Message *)0xc1fced);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc1fd5e);
  local_3fc = 1;
  local_410 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)in_stack_fffffffffffff4f8,
                          (int)((ulong)in_stack_fffffffffffff4f0 >> 0x20));
  local_408 = google::
              BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(in_stack_fffffffffffff4f0,(key_type *)in_stack_fffffffffffff4e8);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff508,(char *)in_stack_fffffffffffff500,
             (uint *)in_stack_fffffffffffff4f8,(unsigned_long *)in_stack_fffffffffffff4f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3f8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff520);
    testing::AssertionResult::failure_message((AssertionResult *)0xc1fe46);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff520,type,(char *)in_stack_fffffffffffff510,
               (int)((ulong)in_stack_fffffffffffff508 >> 0x20),(char *)in_stack_fffffffffffff500);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff570,
               (Message *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4f0);
    testing::Message::~Message((Message *)0xc1fea9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc1ff1a);
  local_434 = 0;
  local_448 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)in_stack_fffffffffffff4f8,
                          (int)((ulong)in_stack_fffffffffffff4f0 >> 0x20));
  local_440 = google::
              BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(in_stack_fffffffffffff4f0,(key_type *)in_stack_fffffffffffff4e8);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff508,(char *)in_stack_fffffffffffff500,
             (uint *)in_stack_fffffffffffff4f8,(unsigned_long *)in_stack_fffffffffffff4f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_430);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff520);
    testing::AssertionResult::failure_message((AssertionResult *)0xc1fff3);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff520,type,(char *)in_stack_fffffffffffff510,
               (int)((ulong)in_stack_fffffffffffff508 >> 0x20),(char *)in_stack_fffffffffffff500);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff570,
               (Message *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4f0);
    testing::Message::~Message((Message *)0xc20056);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc200c7);
  local_46c = 0;
  local_480 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)in_stack_fffffffffffff4f8,
                          (int)((ulong)in_stack_fffffffffffff4f0 >> 0x20));
  local_478 = google::
              BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(in_stack_fffffffffffff4f0,(key_type *)in_stack_fffffffffffff4e8);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff508,(char *)in_stack_fffffffffffff500,
             (uint *)in_stack_fffffffffffff4f8,(unsigned_long *)in_stack_fffffffffffff4f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_468);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff520);
    testing::AssertionResult::failure_message((AssertionResult *)0xc201af);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff520,type,(char *)in_stack_fffffffffffff510,
               (int)((ulong)in_stack_fffffffffffff508 >> 0x20),(char *)in_stack_fffffffffffff500);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff570,
               (Message *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4f0);
    testing::Message::~Message((Message *)0xc20212);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc20283);
  local_4a4 = 0;
  local_4b8 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)in_stack_fffffffffffff4f8,
                          (int)((ulong)in_stack_fffffffffffff4f0 >> 0x20));
  local_4b0 = google::
              BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(in_stack_fffffffffffff4f0,(key_type *)in_stack_fffffffffffff4e8);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff508,(char *)in_stack_fffffffffffff500,
             (uint *)in_stack_fffffffffffff4f8,(unsigned_long *)in_stack_fffffffffffff4f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4a0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff520);
    testing::AssertionResult::failure_message((AssertionResult *)0xc2035c);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff520,type,(char *)in_stack_fffffffffffff510,
               (int)((ulong)in_stack_fffffffffffff508 >> 0x20),(char *)in_stack_fffffffffffff500);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff570,
               (Message *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4f0);
    testing::Message::~Message((Message *)0xc203bf);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc20430);
  google::
  swap<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
            ((HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)in_stack_fffffffffffff4f0,
             (HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)in_stack_fffffffffffff4e8);
  local_4e0 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)in_stack_fffffffffffff4f8,
                          (int)((ulong)in_stack_fffffffffffff4f0 >> 0x20));
  local_4e8 = google::
              BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::deleted_key((BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)in_stack_fffffffffffff4e8);
  testing::internal::EqHelper::Compare<std::pair<int,_int>,_std::pair<int,_int>,_nullptr>
            ((char *)in_stack_fffffffffffff508,(char *)in_stack_fffffffffffff500,
             (pair<int,_int> *)in_stack_fffffffffffff4f8,(pair<int,_int> *)in_stack_fffffffffffff4f0
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4d8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff520);
    testing::AssertionResult::failure_message((AssertionResult *)0xc20515);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff520,type,(char *)in_stack_fffffffffffff510,
               (int)((ulong)in_stack_fffffffffffff508 >> 0x20),(char *)in_stack_fffffffffffff500);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff570,
               (Message *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4f0);
    testing::Message::~Message((Message *)0xc20578);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc205e9);
  local_510 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)in_stack_fffffffffffff4f8,
                          (int)((ulong)in_stack_fffffffffffff4f0 >> 0x20));
  local_518 = google::
              BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::deleted_key((BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)in_stack_fffffffffffff4e8);
  testing::internal::EqHelper::Compare<std::pair<int,_int>,_std::pair<int,_int>,_nullptr>
            ((char *)in_stack_fffffffffffff508,(char *)in_stack_fffffffffffff500,
             (pair<int,_int> *)in_stack_fffffffffffff4f8,(pair<int,_int> *)in_stack_fffffffffffff4f0
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_508);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff520);
    testing::AssertionResult::failure_message((AssertionResult *)0xc206af);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff520,type,(char *)in_stack_fffffffffffff510,
               (int)((ulong)in_stack_fffffffffffff508 >> 0x20),(char *)in_stack_fffffffffffff500);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff570,
               (Message *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4f0);
    testing::Message::~Message((Message *)0xc20712);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc20783);
  local_53c = 0;
  local_560 = (Hasher)google::
                      BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      ::hash_funct(in_stack_fffffffffffff500);
  local_550 = local_560;
  local_540 = Hasher::id(&local_550);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffff508,(char *)in_stack_fffffffffffff500,
             (int *)in_stack_fffffffffffff4f8,(int *)in_stack_fffffffffffff4f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_538);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff520);
    testing::AssertionResult::failure_message((AssertionResult *)0xc20873);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff520,type,(char *)in_stack_fffffffffffff510,
               (int)((ulong)in_stack_fffffffffffff508 >> 0x20),(char *)in_stack_fffffffffffff500);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff570,
               (Message *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4f0);
    testing::Message::~Message((Message *)0xc208d6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc20947);
  local_584 = 1;
  HVar3 = (Hasher)google::
                  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  ::hash_funct(in_stack_fffffffffffff500);
  local_5a8 = HVar3;
  local_598 = HVar3;
  local_588 = Hasher::id(&local_598);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffff508,(char *)in_stack_fffffffffffff500,
             (int *)in_stack_fffffffffffff4f8,(int *)in_stack_fffffffffffff4f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_580);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff520);
    testing::AssertionResult::failure_message((AssertionResult *)0xc20a33);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff520,type,(char *)in_stack_fffffffffffff510,
               (int)((ulong)in_stack_fffffffffffff508 >> 0x20),(char *)in_stack_fffffffffffff500);
    testing::internal::AssertHelper::operator=
              (HVar3._0_8_,(Message *)CONCAT44(HVar3.num_compares_,in_stack_fffffffffffff568));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4f0);
    testing::Message::~Message((Message *)0xc20a90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc20b01);
  local_5cc = 0x7cc;
  local_5d8 = google::
              BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xc20b1d);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff508,(char *)in_stack_fffffffffffff500,
             (uint *)in_stack_fffffffffffff4f8,(unsigned_long *)in_stack_fffffffffffff4f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_5c8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff520);
    testing::AssertionResult::failure_message((AssertionResult *)0xc20ba4);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff520,type,(char *)in_stack_fffffffffffff510,
               (int)((ulong)in_stack_fffffffffffff508 >> 0x20),(char *)in_stack_fffffffffffff500);
    testing::internal::AssertHelper::operator=
              (HVar3._0_8_,(Message *)CONCAT44(HVar3.num_compares_,in_stack_fffffffffffff568));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4f0);
    testing::Message::~Message((Message *)0xc20c01);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc20c6f);
  local_5fc = 1;
  local_608 = google::
              BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xc20c87);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff508,(char *)in_stack_fffffffffffff500,
             (uint *)in_stack_fffffffffffff4f8,(unsigned_long *)in_stack_fffffffffffff4f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_5f8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff520);
    testing::AssertionResult::failure_message((AssertionResult *)0xc20d0e);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff520,type,(char *)in_stack_fffffffffffff510,
               (int)((ulong)in_stack_fffffffffffff508 >> 0x20),(char *)in_stack_fffffffffffff500);
    testing::internal::AssertHelper::operator=
              (HVar3._0_8_,(Message *)CONCAT44(HVar3.num_compares_,in_stack_fffffffffffff568));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4f0);
    testing::Message::~Message((Message *)0xc20d6b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc20ddc);
  local_62c = 1;
  local_640 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)in_stack_fffffffffffff4f8,
                          (int)((ulong)in_stack_fffffffffffff4f0 >> 0x20));
  local_638 = google::
              BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(in_stack_fffffffffffff4f0,(key_type *)in_stack_fffffffffffff4e8);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff508,(char *)in_stack_fffffffffffff500,
             (uint *)in_stack_fffffffffffff4f8,(unsigned_long *)in_stack_fffffffffffff4f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_628);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff520);
    in_stack_fffffffffffff520 =
         (HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          *)testing::AssertionResult::failure_message((AssertionResult *)0xc20eb2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff520,type,(char *)in_stack_fffffffffffff510,
               (int)((ulong)in_stack_fffffffffffff508 >> 0x20),(char *)in_stack_fffffffffffff500);
    testing::internal::AssertHelper::operator=
              (HVar3._0_8_,(Message *)CONCAT44(HVar3.num_compares_,in_stack_fffffffffffff568));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4f0);
    testing::Message::~Message((Message *)0xc20f0f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc20f80);
  local_664 = 0;
  kVar2 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffff4f8,(int)((ulong)in_stack_fffffffffffff4f0 >> 0x20));
  local_678 = kVar2;
  hf = (hasher *)
       google::
       BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       ::count(in_stack_fffffffffffff4f0,(key_type *)in_stack_fffffffffffff4e8);
  local_670 = hf;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff508,(char *)in_stack_fffffffffffff500,
             (uint *)in_stack_fffffffffffff4f8,(unsigned_long *)in_stack_fffffffffffff4f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_660);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff520);
    in_stack_fffffffffffff508 =
         (key_equal *)testing::AssertionResult::failure_message((AssertionResult *)0xc2104d);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff520,kVar2.second,(char *)hf,
               (int)((ulong)in_stack_fffffffffffff508 >> 0x20),(char *)in_stack_fffffffffffff500);
    testing::internal::AssertHelper::operator=
              (HVar3._0_8_,(Message *)CONCAT44(HVar3.num_compares_,in_stack_fffffffffffff568));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff4f0);
    testing::Message::~Message((Message *)0xc210aa);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc2111b);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8.second);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8.second);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_738,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            (in_stack_fffffffffffff520,(size_type)kVar2,hf,in_stack_fffffffffffff508,
             (allocator_type *)in_stack_fffffffffffff500);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_738);
  alloc = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffff4f8,(int)((ulong)in_stack_fffffffffffff4f0 >> 0x20));
  local_740 = alloc;
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key(in_stack_fffffffffffff4f0,(key_type *)in_stack_fffffffffffff4e8);
  for (local_744 = 2; local_744 < 10000; local_744 = local_744 + 1) {
    in_stack_fffffffffffff4f8 =
         HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)in_stack_fffffffffffff4e8,0);
    local_74c = in_stack_fffffffffffff4f8;
    google::
    BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(HVar3._0_8_,(value_type *)CONCAT44(HVar3.num_compares_,in_stack_fffffffffffff568));
  }
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8.second);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8.second);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_828,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            (in_stack_fffffffffffff520,(size_type)kVar2,hf,in_stack_fffffffffffff508,
             (allocator_type *)alloc);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_828);
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::swap(in_stack_fffffffffffff4f0,
         (BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)in_stack_fffffffffffff4e8);
  kVar2 = HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffff4f8,(int)((ulong)in_stack_fffffffffffff4f0 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     *)kVar2,(key_type *)in_stack_fffffffffffff4e8);
  for (local_834 = 2; local_834 < 10000; local_834 = local_834 + 1) {
    in_stack_fffffffffffff4e8 =
         HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)in_stack_fffffffffffff4e8,0);
    google::
    BaseHashtableInterface<google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(HVar3._0_8_,(value_type *)CONCAT44(HVar3.num_compares_,in_stack_fffffffffffff568));
  }
  google::
  HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xc21418);
  google::
  HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xc21425);
  google::
  HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xc21432);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Swap) {
  // Let's make a second hashtable with its own hasher, key_equal, etc.
  typename TypeParam::hasher hasher(1);  // 1 is a unique id
  TypeParam other_ht(200, hasher, hasher);

  this->ht_.set_deleted_key(this->UniqueKey(1));
  other_ht.set_deleted_key(this->UniqueKey(2));

  for (int i = 3; i < 2000; i++) {
    this->ht_.insert(this->UniqueObject(i));
  }
  this->ht_.erase(this->UniqueKey(1000));
  other_ht.insert(this->UniqueObject(2001));
  typename TypeParam::size_type expected_buckets = other_ht.bucket_count();

  this->ht_.swap(other_ht);

  EXPECT_EQ(this->UniqueKey(2), this->ht_.deleted_key());
  EXPECT_EQ(this->UniqueKey(1), other_ht.deleted_key());

  EXPECT_EQ(1, this->ht_.hash_funct().id());
  EXPECT_EQ(0, other_ht.hash_funct().id());

  EXPECT_EQ(1, this->ht_.key_eq().id());
  EXPECT_EQ(0, other_ht.key_eq().id());

  EXPECT_EQ(expected_buckets, this->ht_.bucket_count());
  EXPECT_GT(other_ht.bucket_count(), 200u);

  EXPECT_EQ(1u, this->ht_.size());
  EXPECT_EQ(1996u, other_ht.size());  // because we erased 1000

  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(111)));
  EXPECT_EQ(1u, other_ht.count(this->UniqueKey(111)));
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(2001)));
  EXPECT_EQ(0u, other_ht.count(this->UniqueKey(2001)));
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(1000)));
  EXPECT_EQ(0u, other_ht.count(this->UniqueKey(1000)));

// We purposefully don't swap allocs -- they're not necessarily swappable.

// Now swap back, using the free-function swap
// NOTE: MSVC seems to have trouble with this free swap, not quite
// sure why.  I've given up trying to fix it though.
#ifdef _MSC_VER
  other_ht.swap(this->ht_);
#else
  swap(this->ht_, other_ht);
#endif

  EXPECT_EQ(this->UniqueKey(1), this->ht_.deleted_key());
  EXPECT_EQ(this->UniqueKey(2), other_ht.deleted_key());
  EXPECT_EQ(0, this->ht_.hash_funct().id());
  EXPECT_EQ(1, other_ht.hash_funct().id());
  EXPECT_EQ(1996u, this->ht_.size());
  EXPECT_EQ(1u, other_ht.size());
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(111)));
  EXPECT_EQ(0u, other_ht.count(this->UniqueKey(111)));

  // A user reported a crash with this code using swap to clear.
  // We've since fixed the bug; this prevents a regression.
  TypeParam swap_to_clear_ht;
  swap_to_clear_ht.set_deleted_key(this->UniqueKey(1));
  for (int i = 2; i < 10000; ++i) {
    swap_to_clear_ht.insert(this->UniqueObject(i));
  }
  TypeParam empty_ht;
  empty_ht.swap(swap_to_clear_ht);
  swap_to_clear_ht.set_deleted_key(this->UniqueKey(1));
  for (int i = 2; i < 10000; ++i) {
    swap_to_clear_ht.insert(this->UniqueObject(i));
  }
}